

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O0

size_t __thiscall
CCharmapToUniUcs2::map2
          (CCharmapToUniUcs2 *this,char **output_ptr,size_t *output_buf_len,char *input_ptr,
          size_t input_len,size_t *partial_len)

{
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  ulong in_R8;
  ulong *in_R9;
  
  *in_R9 = in_R8 & 1;
  sVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  return sVar1;
}

Assistant:

virtual size_t map2(char **output_ptr, size_t *output_buf_len,
                        const char *input_ptr, size_t input_len,
                        size_t *partial_len) const
    {
        /* 
         *   if the input length is odd, there's one byte of partial
         *   character information at the end of the buffer; otherwise
         *   everything is valid 
         */
        *partial_len = (input_len & 1);

        /* perform the usual mapping */
        return map(output_ptr, output_buf_len, input_ptr, input_len);
    }